

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O2

void __thiscall ki::protocol::net::ServerSession::on_session_accept(ServerSession *this)

{
  _func_int **pp_Var1;
  uint16_t uVar2;
  long lVar3;
  undefined8 uVar4;
  _func_int *p_Var5;
  SessionAccept accept;
  SessionAccept local_28;
  
  control::SessionAccept::SessionAccept(&accept,0,0,0);
  Session::read_data<ki::protocol::control::SessionAccept>
            (&local_28,
             (Session *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]));
  accept.m_milliseconds = local_28.m_milliseconds;
  accept.m_session_id = local_28.m_session_id;
  accept._10_2_ = local_28._10_2_;
  accept.m_timestamp = local_28.m_timestamp;
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (lVar3 - *(long *)(&this->field_0x18 + (long)this->_vptr_ServerSession[-3]) < 4000000000) {
    uVar2 = control::SessionAccept::get_session_id(&accept);
    p_Var5 = (_func_int *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]);
    if (uVar2 == *(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ServerSession[-3])) {
      p_Var5[10] = (code)0x1;
      uVar4 = std::chrono::_V2::steady_clock::now();
      pp_Var1 = this->_vptr_ServerSession;
      *(undefined8 *)(&this->field_0x20 + (long)pp_Var1[-3]) = uVar4;
      *(undefined8 *)(&this->field_0x28 + (long)pp_Var1[-3]) =
           *(undefined8 *)(&this->field_0x20 + (long)pp_Var1[-3]);
      (*pp_Var1[3])(this);
      return;
    }
    lVar3 = *(long *)p_Var5;
    uVar4 = 6;
  }
  else {
    p_Var5 = (_func_int *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]);
    lVar3 = *(long *)p_Var5;
    uVar4 = 7;
  }
  (**(code **)(lVar3 + 0x38))(p_Var5,uVar4);
  return;
}

Assistant:

void ServerSession::on_session_accept()
	{
		// Read the payload data into a structure
		control::SessionAccept accept;
		try
		{
			accept = read_data<control::SessionAccept>();
		}
		catch (parse_error &e)
		{
			// The SESSION_ACCEPT wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Should this session have already timed out?
		if (std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_connection_time
			).count() > KI_CONNECTION_TIMEOUT)
		{
			close(SessionCloseErrorCode::SESSION_OFFER_TIMED_OUT);
			return;
		}

		// Make sure they're accepting this session
		if (accept.get_session_id() != m_id)
		{
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// The session is successfully established
		m_established = true;
		m_establish_time = std::chrono::steady_clock::now();
		m_last_received_heartbeat_time = m_establish_time;
		on_established();
	}